

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state.cc
# Opt level: O1

size_t tchecker::ta::shared_hash_value(state_t *s)

{
  size_t x;
  size_t sVar1;
  ulong uVar2;
  intrusive_shared_ptr_t<const_tchecker::make_shared_t<tchecker::intval_t,_unsigned_long,_1UL>_>
  local_18;
  
  sVar1 = syncprod::shared_hash_value(&s->super_state_t);
  local_18._t = (make_shared_t<tchecker::intval_t,_unsigned_long,_1UL> *)0x0;
  intrusive_shared_ptr_t<const_tchecker::make_shared_t<tchecker::intval_t,_unsigned_long,_1UL>_>::
  reset(&local_18,(s->_intval)._t);
  uVar2 = ((long)&((local_18._t)->super_intval_t).super_integer_array_t.super_intval_base_t.
                  super_array_capacity_t<unsigned_short>._capacity + ((ulong)local_18._t >> 3)) *
          -0x395b586ca42e166b;
  intrusive_shared_ptr_t<const_tchecker::make_shared_t<tchecker::intval_t,_unsigned_long,_1UL>_>::
  ~intrusive_shared_ptr_t(&local_18);
  return ((uVar2 >> 0x2f ^ uVar2) * -0x395b586ca42e166b ^ sVar1) * -0x395b586ca42e166b + 0xe6546b64;
}

Assistant:

std::size_t shared_hash_value(tchecker::ta::state_t const & s)
{
  std::size_t h = tchecker::syncprod::shared_hash_value(s);
  boost::hash_combine(h, s.intval_ptr());
  return h;
}